

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilter_computeSigmaPoints_Test::~UnscentedKalmanFilter_computeSigmaPoints_Test
          (UnscentedKalmanFilter_computeSigmaPoints_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, computeSigmaPoints) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Init variables
    ukf.gamma = 2;
    ukf.x << 1.f, 2.f, 3.f;
    ukf.P.setIdentity();
    
    ASSERT_TRUE(ukf.computeSigmaPoints());
    
    ASSERT_FLOAT_EQ(1, ukf.sigmaStatePoints(0,0));
    ASSERT_FLOAT_EQ(2, ukf.sigmaStatePoints(1,0));
    ASSERT_FLOAT_EQ(3, ukf.sigmaStatePoints(2,0));
    
    // Center block diagonal
    ASSERT_FLOAT_EQ(3, ukf.sigmaStatePoints(0,1));
    ASSERT_FLOAT_EQ(4, ukf.sigmaStatePoints(1,2));
    ASSERT_FLOAT_EQ(5, ukf.sigmaStatePoints(2,3));
    
    // Right block diagonal
    ASSERT_FLOAT_EQ(-1, ukf.sigmaStatePoints(0,4));
    ASSERT_FLOAT_EQ(0,  ukf.sigmaStatePoints(1,5));
    ASSERT_FLOAT_EQ(1,  ukf.sigmaStatePoints(2,6));
}